

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O1

void __thiscall
pbrt::DiffuseAreaLight::DiffuseAreaLight
          (DiffuseAreaLight *this,Transform *renderFromLight,MediumInterface *mediumInterface,
          SpectrumHandle *Le,Float scale,ShapeHandle *shape,Image *im,RGBColorSpace *imageColorSpace
          ,bool twoSided,Allocator alloc)

{
  ulong uVar1;
  float fVar2;
  short sVar3;
  size_t sVar4;
  memory_resource *pmVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  int iVar21;
  bool bVar22;
  anon_union_16_1_a7e8d694_for_InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>_5
  *paVar23;
  ulong uVar24;
  float *pfVar25;
  Curve *this_00;
  long lVar26;
  long *plVar27;
  long in_FS_OFFSET;
  float fVar28;
  undefined1 auVar29 [16];
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  requestedChannels;
  int va;
  SpectrumHandle *local_d0;
  Transform *local_c8;
  size_t vb;
  size_type local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0;
  undefined1 *local_a0 [2];
  undefined1 local_90 [16];
  long *local_80 [2];
  long local_70 [2];
  ImageChannelDesc desc;
  
  (this->super_LightBase).type = Area;
  (this->super_LightBase).mediumInterface.inside.
  super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
  .bits = 0;
  (this->super_LightBase).mediumInterface.inside.
  super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
  .bits = (mediumInterface->inside).
          super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
          .bits;
  (this->super_LightBase).mediumInterface.outside.
  super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
  .bits = 0;
  (this->super_LightBase).mediumInterface.outside.
  super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
  .bits = (mediumInterface->outside).
          super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
          .bits;
  uVar6 = *(undefined8 *)((renderFromLight->m).m[0] + 2);
  uVar7 = *(undefined8 *)(renderFromLight->m).m[1];
  uVar8 = *(undefined8 *)((renderFromLight->m).m[1] + 2);
  uVar9 = *(undefined8 *)(renderFromLight->m).m[2];
  uVar10 = *(undefined8 *)((renderFromLight->m).m[2] + 2);
  uVar11 = *(undefined8 *)(renderFromLight->m).m[3];
  uVar12 = *(undefined8 *)((renderFromLight->m).m[3] + 2);
  uVar13 = *(undefined8 *)(renderFromLight->mInv).m[0];
  uVar14 = *(undefined8 *)((renderFromLight->mInv).m[0] + 2);
  uVar15 = *(undefined8 *)(renderFromLight->mInv).m[1];
  uVar16 = *(undefined8 *)((renderFromLight->mInv).m[1] + 2);
  uVar17 = *(undefined8 *)(renderFromLight->mInv).m[2];
  uVar18 = *(undefined8 *)((renderFromLight->mInv).m[2] + 2);
  uVar19 = *(undefined8 *)(renderFromLight->mInv).m[3];
  uVar20 = *(undefined8 *)((renderFromLight->mInv).m[3] + 2);
  *(undefined8 *)(this->super_LightBase).renderFromLight.m.m[0] =
       *(undefined8 *)(renderFromLight->m).m[0];
  *(undefined8 *)((this->super_LightBase).renderFromLight.m.m[0] + 2) = uVar6;
  *(undefined8 *)(this->super_LightBase).renderFromLight.m.m[1] = uVar7;
  *(undefined8 *)((this->super_LightBase).renderFromLight.m.m[1] + 2) = uVar8;
  *(undefined8 *)(this->super_LightBase).renderFromLight.m.m[2] = uVar9;
  *(undefined8 *)((this->super_LightBase).renderFromLight.m.m[2] + 2) = uVar10;
  *(undefined8 *)(this->super_LightBase).renderFromLight.m.m[3] = uVar11;
  *(undefined8 *)((this->super_LightBase).renderFromLight.m.m[3] + 2) = uVar12;
  *(undefined8 *)(this->super_LightBase).renderFromLight.mInv.m[0] = uVar13;
  *(undefined8 *)((this->super_LightBase).renderFromLight.mInv.m[0] + 2) = uVar14;
  *(undefined8 *)(this->super_LightBase).renderFromLight.mInv.m[1] = uVar15;
  *(undefined8 *)((this->super_LightBase).renderFromLight.mInv.m[1] + 2) = uVar16;
  *(undefined8 *)(this->super_LightBase).renderFromLight.mInv.m[2] = uVar17;
  *(undefined8 *)((this->super_LightBase).renderFromLight.mInv.m[2] + 2) = uVar18;
  *(undefined8 *)(this->super_LightBase).renderFromLight.mInv.m[3] = uVar19;
  *(undefined8 *)((this->super_LightBase).renderFromLight.mInv.m[3] + 2) = uVar20;
  *(long *)(in_FS_OFFSET + -0x228) = *(long *)(in_FS_OFFSET + -0x228) + 1;
  vb = (Le->
       super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
       ).bits;
  local_d0 = Le;
  local_c8 = renderFromLight;
  DenselySampledSpectrum::DenselySampledSpectrum
            (&this->Lemit,(SpectrumHandle *)&vb,0x168,0x33e,alloc);
  this->scale = scale;
  (this->shape).
  super_TaggedPointer<pbrt::Sphere,_pbrt::Cylinder,_pbrt::Disk,_pbrt::Triangle,_pbrt::BilinearPatch,_pbrt::Curve>
  .bits = 0;
  (this->shape).
  super_TaggedPointer<pbrt::Sphere,_pbrt::Cylinder,_pbrt::Disk,_pbrt::Triangle,_pbrt::BilinearPatch,_pbrt::Curve>
  .bits = (shape->
          super_TaggedPointer<pbrt::Sphere,_pbrt::Cylinder,_pbrt::Disk,_pbrt::Triangle,_pbrt::BilinearPatch,_pbrt::Curve>
          ).bits;
  this->twoSided = twoSided;
  uVar1 = (shape->
          super_TaggedPointer<pbrt::Sphere,_pbrt::Cylinder,_pbrt::Disk,_pbrt::Triangle,_pbrt::BilinearPatch,_pbrt::Curve>
          ).bits;
  sVar3 = (short)(uVar1 >> 0x30);
  if (uVar1 >> 0x32 == 0) {
    pfVar25 = (float *)(uVar1 & 0xffffffffffff);
    if (uVar1 >> 0x31 == 0) {
      fVar28 = pfVar25[5] * *pfVar25 * (pfVar25[2] - pfVar25[1]);
    }
    else if (sVar3 == 2) {
      fVar28 = (pfVar25[7] - pfVar25[6]) * pfVar25[5] * pfVar25[8];
    }
    else {
      fVar28 = (float)*(undefined8 *)(pfVar25 + 6);
      fVar2 = (float)((ulong)*(undefined8 *)(pfVar25 + 6) >> 0x20);
      auVar29._0_4_ = fVar28 * fVar28;
      auVar29._4_4_ = fVar2 * fVar2;
      auVar29._8_8_ = 0;
      auVar29 = vhsubps_avx(auVar29,auVar29);
      fVar28 = pfVar25[8] * 0.5 * auVar29._0_4_;
    }
  }
  else {
    this_00 = (Curve *)(uVar1 & 0xffffffffffff);
    if (uVar1 >> 0x30 == 5) {
      fVar28 = this_00->uMin;
    }
    else if (sVar3 == 4) {
      fVar28 = Triangle::Area((Triangle *)this_00);
    }
    else {
      fVar28 = Curve::Area(this_00);
    }
  }
  this->area = fVar28;
  this->imageColorSpace = imageColorSpace;
  iVar21 = (im->resolution).super_Tuple2<pbrt::Point2,_int>.x;
  (this->image).format = im->format;
  (this->image).resolution.super_Tuple2<pbrt::Point2,_int>.x = iVar21;
  (this->image).resolution.super_Tuple2<pbrt::Point2,_int>.y =
       (im->resolution).super_Tuple2<pbrt::Point2,_int>.y;
  InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::InlinedVector(&(this->image).channelNames,&im->channelNames);
  (this->image).encoding.
  super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>.
  bits = 0;
  pmVar5 = (im->p8).alloc.memoryResource;
  (this->image).encoding.
  super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>.
  bits = (im->encoding).
         super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
         .bits;
  (this->image).p8.alloc.memoryResource = pmVar5;
  auVar29 = ZEXT816(0) << 0x20;
  (this->image).p8.ptr = (uchar *)auVar29._0_8_;
  (this->image).p8.nAlloc = auVar29._8_8_;
  (this->image).p8.nStored = 0;
  sVar4 = (im->p8).nStored;
  (this->image).p8.nAlloc = (im->p8).nAlloc;
  (this->image).p8.nStored = sVar4;
  (this->image).p8.ptr = (im->p8).ptr;
  (im->p8).nStored = 0;
  (im->p8).ptr = (uchar *)auVar29._0_8_;
  (im->p8).nAlloc = auVar29._8_8_;
  (this->image).p16.alloc.memoryResource = (im->p16).alloc.memoryResource;
  (this->image).p16.nStored = 0;
  (this->image).p16.ptr = (Half *)auVar29._0_8_;
  (this->image).p16.nAlloc = auVar29._8_8_;
  sVar4 = (im->p16).nStored;
  (this->image).p16.nAlloc = (im->p16).nAlloc;
  (this->image).p16.nStored = sVar4;
  (this->image).p16.ptr = (im->p16).ptr;
  (im->p16).nStored = 0;
  (im->p16).ptr = (Half *)auVar29._0_8_;
  (im->p16).nAlloc = auVar29._8_8_;
  (this->image).p32.alloc.memoryResource = (im->p32).alloc.memoryResource;
  (this->image).p32.nStored = 0;
  (this->image).p32.ptr = (float *)auVar29._0_8_;
  (this->image).p32.nAlloc = auVar29._8_8_;
  sVar4 = (im->p32).nStored;
  (this->image).p32.nAlloc = (im->p32).nAlloc;
  (this->image).p32.nStored = sVar4;
  (this->image).p32.ptr = (im->p32).ptr;
  (im->p32).nStored = 0;
  (im->p32).ptr = (float *)auVar29._0_8_;
  (im->p32).nAlloc = auVar29._8_8_;
  *(long *)(in_FS_OFFSET + -0x218) = *(long *)(in_FS_OFFSET + -0x218) + 1;
  if (((this->image).resolution.super_Tuple2<pbrt::Point2,_int>.x < 1) ||
     ((this->image).resolution.super_Tuple2<pbrt::Point2,_int>.y < 1)) {
    if (((local_d0->
         super_TaggedPointer<pbrt::ConstantSpectrum,_pbrt::DenselySampledSpectrum,_pbrt::PiecewiseLinearSpectrum,_pbrt::RGBSpectrum,_pbrt::RGBReflectanceSpectrum,_pbrt::BlackbodySpectrum>
         ).bits & 0xffffffffffff) == 0) {
      LogFatal<char_const(&)[3]>
                (Fatal,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/lights.cpp"
                 ,0x268,"Check failed: %s",(char (*) [3])"Le");
    }
LAB_00330fb4:
    bVar22 = Transform::HasScale(local_c8,0.001);
    if ((bVar22) &&
       ((ushort)((ushort)((shape->
                          super_TaggedPointer<pbrt::Sphere,_pbrt::Cylinder,_pbrt::Disk,_pbrt::Triangle,_pbrt::BilinearPatch,_pbrt::Curve>
                          ).bits >> 0x30) | 1) != 5)) {
      local_b8 = 0;
      local_b0._M_local_buf[0] = '\0';
      vb = (size_t)&local_b0;
      detail::stringPrintfRecursive
                ((string *)&vb,
                 "Scaling detected in world to light transformation! The system has numerous assumptions, implicit and explicit, that this transform will have no scale factors in it. Proceed at your own risk; your image may have errors."
                );
      Warning((FileLoc *)0x0,(char *)vb);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)vb != &local_b0) {
        operator_delete((void *)vb,
                        CONCAT71(local_b0._M_allocated_capacity._1_7_,local_b0._M_local_buf[0]) + 1)
        ;
      }
    }
    return;
  }
  vb = (size_t)&local_b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&vb,"R","");
  local_a0[0] = local_90;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a0,"G","");
  plVar27 = local_70;
  local_80[0] = plVar27;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_80,"B","");
  requestedChannels.n = 3;
  requestedChannels.ptr = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vb;
  Image::GetChannelDesc(&desc,&this->image,requestedChannels);
  lVar26 = -0x60;
  do {
    if (plVar27 != (long *)plVar27[-2]) {
      operator_delete((long *)plVar27[-2],*plVar27 + 1);
    }
    plVar27 = plVar27 + -4;
    lVar26 = lVar26 + 0x20;
  } while (lVar26 != 0);
  if (desc.offset.nStored == 0) {
    ErrorExit<>("Image used for DiffuseAreaLight doesn\'t have R, G, B channels.");
  }
  va = 3;
  vb = desc.offset.nStored;
  if (desc.offset.nStored != 3) {
    LogFatal<char_const(&)[2],char_const(&)[12],char_const(&)[2],int&,char_const(&)[12],unsigned_long&>
              (Fatal,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/lights.cpp"
               ,0x264,"Check failed: %s == %s with %s = %s, %s = %s",(char (*) [2])0x463c9d,
               (char (*) [12])"desc.size()",(char (*) [2])0x463c9d,&va,(char (*) [12])"desc.size()",
               (unsigned_long *)&vb);
  }
  paVar23 = (anon_union_16_1_a7e8d694_for_InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>_5
             *)desc.offset.ptr;
  if (desc.offset.ptr == (int *)0x0) {
    paVar23 = &desc.offset.field_2;
  }
  if (paVar23->fixed[0] == 0) {
    uVar1 = 1;
    do {
      uVar24 = uVar1;
      if (uVar24 == 3) break;
      uVar1 = uVar24 + 1;
    } while (uVar24 == (long)paVar23->fixed[uVar24]);
    if (2 < uVar24) {
      if (imageColorSpace == (RGBColorSpace *)0x0) {
        LogFatal<char_const(&)[27]>
                  (Fatal,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/lights.cpp"
                   ,0x266,"Check failed: %s",(char (*) [27])"imageColorSpace != nullptr");
      }
      desc.offset.nStored = 0;
      (*(desc.offset.alloc.memoryResource)->_vptr_memory_resource[3])
                (desc.offset.alloc.memoryResource,desc.offset.ptr,desc.offset.nAlloc << 2,4);
      goto LAB_00330fb4;
    }
  }
  LogFatal<char_const(&)[18]>
            (Fatal,
             "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/lights.cpp"
             ,0x265,"Check failed: %s",(char (*) [18])"desc.IsIdentity()");
}

Assistant:

DiffuseAreaLight::DiffuseAreaLight(const Transform &renderFromLight,
                                   const MediumInterface &mediumInterface,
                                   SpectrumHandle Le, Float scale,
                                   const ShapeHandle shape, Image im,
                                   const RGBColorSpace *imageColorSpace, bool twoSided,
                                   Allocator alloc)
    : LightBase(LightType::Area, renderFromLight, mediumInterface),
      Lemit(Le, alloc),
      scale(scale),
      shape(shape),
      twoSided(twoSided),
      area(shape.Area()),
      imageColorSpace(imageColorSpace),
      image(std::move(im)) {
    ++numAreaLights;

    if (image) {
        ImageChannelDesc desc = image.GetChannelDesc({"R", "G", "B"});
        if (!desc)
            ErrorExit("Image used for DiffuseAreaLight doesn't have R, G, B "
                      "channels.");
        CHECK_EQ(3, desc.size());
        CHECK(desc.IsIdentity());
        CHECK(imageColorSpace != nullptr);
    } else {
        CHECK(Le);
    }

    // Warn if light has transformation with non-uniform scale, though not
    // for Triangles, since this doesn't matter for them.
    // FIXME: is this still true with animated transformations?
    if (renderFromLight.HasScale() && !shape.Is<Triangle>() && !shape.Is<BilinearPatch>())
        Warning("Scaling detected in world to light transformation! "
                "The system has numerous assumptions, implicit and explicit, "
                "that this transform will have no scale factors in it. "
                "Proceed at your own risk; your image may have errors.");
}